

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::ReleaseDebugManager(ThreadContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclableData *pRVar4;
  nullptr_t local_20;
  LONG local_14;
  ThreadContext *pTStack_10;
  LONG lref;
  ThreadContext *this_local;
  
  pTStack_10 = this;
  if (this->crefSContextForDiag < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x8e9,"(crefSContextForDiag > 0)","crefSContextForDiag > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->debugManager == (DebugManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x8ea,"(this->debugManager != nullptr)","this->debugManager != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_14 = InterlockedDecrement(&this->crefSContextForDiag);
  if (local_14 == 0) {
    pRVar4 = Memory::RecyclerRootPtr::operator_cast_to_RecyclableData_
                       ((RecyclerRootPtr *)&this->recyclableData);
    if (pRVar4 != (RecyclableData *)0x0) {
      local_20 = (nullptr_t)0x0;
      pRVar4 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                         (&this->recyclableData);
      Memory::
      WriteBarrierPtr<JsUtil::List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
      ::operator=(&pRVar4->returnedValueList,&local_20);
    }
    if (this->debugManager != (DebugManager *)0x0) {
      Js::DebugManager::Close(this->debugManager);
      Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::DebugManager>
                (&Memory::HeapAllocator::Instance,this->debugManager);
      this->debugManager = (DebugManager *)0x0;
    }
  }
  return;
}

Assistant:

void ThreadContext::ReleaseDebugManager()
{
    Assert(crefSContextForDiag > 0);
    Assert(this->debugManager != nullptr);

    LONG lref = InterlockedDecrement(&crefSContextForDiag);

    if (lref == 0)
    {
        if (this->recyclableData != nullptr)
        {
            this->recyclableData->returnedValueList = nullptr;
        }

        if (this->debugManager != nullptr)
        {
            this->debugManager->Close();
            HeapDelete(this->debugManager);
            this->debugManager = nullptr;
        }
    }
}